

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr.hpp
# Opt level: O2

type unodb::qsbr_state::dec_thread_count_and_threads_in_previous_epoch(type word)

{
  qsbr_epoch other;
  bool bVar1;
  qsbr_thread_count_type qVar2;
  qsbr_thread_count_type qVar3;
  qsbr_thread_count_type qVar4;
  type word_00;
  qsbr_epoch local_29;
  
  assert_invariants(word);
  qVar2 = get_thread_count(word);
  if (qVar2 == 0) {
    __assert_fail("get_thread_count(word) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                  ,0x144,
                  "static type unodb::qsbr_state::dec_thread_count_and_threads_in_previous_epoch(type)"
                 );
  }
  qVar3 = get_threads_in_previous_epoch(word);
  if (qVar3 == 0) {
    __assert_fail("get_threads_in_previous_epoch(word) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                  ,0x145,
                  "static type unodb::qsbr_state::dec_thread_count_and_threads_in_previous_epoch(type)"
                 );
  }
  word_00 = word - 0x100000001;
  assert_invariants(word_00);
  local_29 = get_epoch(word);
  other = get_epoch(word_00);
  bVar1 = detail::qsbr_epoch::operator==(&local_29,other);
  if (!bVar1) {
    __assert_fail("get_epoch(word) == get_epoch(result)",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                  ,0x14a,
                  "static type unodb::qsbr_state::dec_thread_count_and_threads_in_previous_epoch(type)"
                 );
  }
  qVar4 = get_threads_in_previous_epoch(word_00);
  if (qVar3 - 1 == qVar4) {
    qVar3 = get_thread_count(word_00);
    if (qVar2 - 1 == qVar3) {
      return word_00;
    }
    __assert_fail("get_thread_count(word) - 1 == get_thread_count(result)",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                  ,0x14d,
                  "static type unodb::qsbr_state::dec_thread_count_and_threads_in_previous_epoch(type)"
                 );
  }
  __assert_fail("get_threads_in_previous_epoch(word) - 1 == get_threads_in_previous_epoch(result)",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                ,0x14c,
                "static type unodb::qsbr_state::dec_thread_count_and_threads_in_previous_epoch(type)"
               );
}

Assistant:

[[nodiscard, gnu::const]] static constexpr type
  dec_thread_count_and_threads_in_previous_epoch(type word) noexcept {
    assert_invariants(word);
    UNODB_DETAIL_ASSERT(get_thread_count(word) > 0);
    UNODB_DETAIL_ASSERT(get_threads_in_previous_epoch(word) > 0);

    const auto result = word - one_thread_and_one_in_previous;

    assert_invariants(result);
    UNODB_DETAIL_ASSERT(get_epoch(word) == get_epoch(result));
    UNODB_DETAIL_ASSERT(get_threads_in_previous_epoch(word) - 1 ==
                        get_threads_in_previous_epoch(result));
    UNODB_DETAIL_ASSERT(get_thread_count(word) - 1 == get_thread_count(result));

    return result;
  }